

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O3

bool __thiscall
adios2::core::engine::BP4Reader::SleepOrQuit
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds)

{
  double dVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  timespec local_20;
  
  lVar3 = std::chrono::_V2::steady_clock::now();
  dVar7 = pollSeconds->__r * 1000000000.0;
  dVar8 = dVar7 + (double)lVar3;
  dVar1 = (timeoutInstant->__d).__r;
  if ((dVar8 < dVar1) &&
     (dVar6 = dVar1 - (double)lVar3, uVar5 = -(ulong)(dVar6 < dVar7),
     dVar7 = (double)(~uVar5 & (ulong)pollSeconds->__r | (ulong)(dVar6 / 1000000000.0) & uVar5),
     0.0 < dVar7)) {
    local_20.tv_sec = (__time_t)dVar7;
    local_20.tv_nsec = (long)((dVar7 - (double)local_20.tv_sec) * 1000000000.0);
    do {
      iVar2 = nanosleep(&local_20,&local_20);
      if (iVar2 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  return dVar8 < dVar1;
}

Assistant:

bool BP4Reader::SleepOrQuit(const TimePoint &timeoutInstant, const Seconds &pollSeconds)
{
    auto now = Now();
    if (now + pollSeconds >= timeoutInstant)
    {
        return false;
    }
    auto remainderTime = timeoutInstant - now;
    auto sleepTime = pollSeconds;
    if (remainderTime < sleepTime)
    {
        sleepTime = remainderTime;
    }
    std::this_thread::sleep_for(sleepTime);
    return true;
}